

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall
aeron::ClientConductor::onSubscriptionReady
          (ClientConductor *this,int64_t registrationId,int32_t channelStatusId)

{
  recursive_mutex *__mutex;
  _Atomic_word *p_Var1;
  pointer pSVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  undefined8 uVar6;
  pointer pSVar7;
  long lVar8;
  pointer pSVar9;
  int32_t local_4c;
  __weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> local_48;
  int32_t channelStatusId_local;
  
  __mutex = &this->m_adminLock;
  channelStatusId_local = channelStatusId;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
    goto LAB_00161eac;
  }
  pSVar9 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = ((long)pSVar2 - (long)pSVar9 >> 6) * -0x5555555555555555 >> 2;
  pSVar7 = pSVar9;
  if (0 < lVar8) {
    pSVar7 = pSVar9 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    pSVar9 = pSVar9 + 2;
    do {
      if (pSVar9[-2].m_registrationId == registrationId) {
        pSVar9 = pSVar9 + -2;
        goto LAB_00161d62;
      }
      if (pSVar9[-1].m_registrationId == registrationId) {
        pSVar9 = pSVar9 + -1;
        goto LAB_00161d62;
      }
      if (pSVar9->m_registrationId == registrationId) goto LAB_00161d62;
      if (pSVar9[1].m_registrationId == registrationId) {
        pSVar9 = pSVar9 + 1;
        goto LAB_00161d62;
      }
      lVar8 = lVar8 + -1;
      pSVar9 = pSVar9 + 4;
    } while (1 < lVar8);
  }
  lVar8 = ((long)pSVar2 - (long)pSVar7 >> 6) * -0x5555555555555555;
  if (lVar8 == 1) {
LAB_00161d3c:
    pSVar9 = pSVar7;
    if (pSVar7->m_registrationId != registrationId) {
      pSVar9 = pSVar2;
    }
  }
  else if (lVar8 == 2) {
LAB_00161d2f:
    pSVar9 = pSVar7;
    if (pSVar7->m_registrationId != registrationId) {
      pSVar7 = pSVar7 + 1;
      goto LAB_00161d3c;
    }
  }
  else {
    pSVar9 = pSVar2;
    if ((lVar8 == 3) && (pSVar9 = pSVar7, pSVar7->m_registrationId != registrationId)) {
      pSVar7 = pSVar7 + 1;
      goto LAB_00161d2f;
    }
  }
LAB_00161d62:
  if ((pSVar9 != pSVar2) && (pSVar9->m_status == AWAITING_MEDIA_DRIVER)) {
    pSVar9->m_status = REGISTERED_MEDIA_DRIVER;
    local_48._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<aeron::Subscription,std::allocator<aeron::Subscription>,aeron::ClientConductor&,long&,std::__cxx11::string&,int&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_refcount,&local_48._M_ptr,
               (allocator<aeron::Subscription> *)&local_4c,this,&pSVar9->m_registrationId,
               &pSVar9->m_channel,&pSVar9->m_streamId,&channelStatusId_local);
    _Var4._M_pi = local_48._M_refcount._M_pi;
    peVar3 = local_48._M_ptr;
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (pSVar9->m_subscriptionCache).
              super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (pSVar9->m_subscriptionCache).
    super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    (pSVar9->m_subscriptionCache).
    super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_refcount._M_pi);
    }
    local_48._M_ptr =
         (pSVar9->m_subscriptionCache).
         super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48._M_refcount._M_pi =
         (pSVar9->m_subscriptionCache).
         super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48._M_refcount._M_pi)->_M_weak_count =
             (local_48._M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_48._M_refcount._M_pi)->_M_weak_count =
             (local_48._M_refcount._M_pi)->_M_weak_count + 1;
      }
    }
    std::__weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pSVar9->m_subscription).
                super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_48._M_refcount._M_pi)->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = (local_48._M_refcount._M_pi)->_M_weak_count;
        (local_48._M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(local_48._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    local_4c = pSVar9->m_streamId;
    local_48._M_ptr = (element_type *)registrationId;
    if ((this->m_onNewSubscriptionHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00161eac:
      uVar6 = std::__throw_bad_function_call();
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar6);
    }
    (*(this->m_onNewSubscriptionHandler)._M_invoker)
              ((_Any_data *)&this->m_onNewSubscriptionHandler,&pSVar9->m_channel,&local_4c,
               (long *)&local_48);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void ClientConductor::onSubscriptionReady(
    std::int64_t registrationId,
    std::int32_t channelStatusId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto subIt = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (subIt != m_subscriptions.end() && (*subIt).m_status == RegistrationStatus::AWAITING_MEDIA_DRIVER)
    {
        SubscriptionStateDefn& state = (*subIt);

        state.m_status = RegistrationStatus::REGISTERED_MEDIA_DRIVER;
        state.m_subscriptionCache = std::make_shared<Subscription>(
            *this, state.m_registrationId, state.m_channel, state.m_streamId, channelStatusId);
        state.m_subscription = std::weak_ptr<Subscription>(state.m_subscriptionCache);
        m_onNewSubscriptionHandler(state.m_channel, state.m_streamId, registrationId);
        return;
    }
}